

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void print_uint8_vector_base64_object(flatcc_json_printer_t *ctx,void *p,int mode)

{
  undefined1 *puVar1;
  flatbuffers_uoffset_t fVar2;
  ulong local_50;
  size_t src_len;
  size_t data_len;
  uint8_t *data;
  size_t len;
  size_t n;
  size_t k;
  int unpadded_mode;
  int mode_local;
  void *p_local;
  flatcc_json_printer_t *ctx_local;
  
  k._0_4_ = mode & 0xffffff7f;
  k._4_4_ = mode;
  _unpadded_mode = p;
  p_local = ctx;
  fVar2 = __flatbuffers_uoffset_read_from_pe(p);
  src_len = (size_t)fVar2;
  data_len = (long)_unpadded_mode + 4;
  puVar1 = *(undefined1 **)((long)p_local + 0x28);
  *(undefined1 **)((long)p_local + 0x28) = puVar1 + 1;
  *puVar1 = 0x22;
  data = (uint8_t *)base64_encoded_size(src_len,k._4_4_);
  if (*(uint8_t **)((long)p_local + 0x20) <= data + *(long *)((long)p_local + 0x28)) {
    (**(code **)((long)p_local + 0x48))(p_local,0);
  }
  while( true ) {
    if (data + *(long *)((long)p_local + 0x28) <= *(uint8_t **)((long)p_local + 0x20)) {
      base64_encode(*(uint8_t **)((long)p_local + 0x28),(uint8_t *)data_len,(size_t *)0x0,&src_len,
                    k._4_4_);
      *(uint8_t **)((long)p_local + 0x28) = data + *(long *)((long)p_local + 0x28);
      puVar1 = *(undefined1 **)((long)p_local + 0x28);
      *(undefined1 **)((long)p_local + 0x28) = puVar1 + 1;
      *puVar1 = 0x22;
      return;
    }
    n = *(long *)((long)p_local + 0x20) - *(long *)((long)p_local + 0x28) & 0xfffffffffffffffc;
    len = n * 3 >> 2;
    if (len == 0) break;
    local_50 = n * 3 >> 2;
    base64_encode(*(uint8_t **)((long)p_local + 0x28),(uint8_t *)data_len,(size_t *)0x0,&local_50,
                  (uint)k);
    *(size_t *)((long)p_local + 0x28) = n + *(long *)((long)p_local + 0x28);
    data_len = len + data_len;
    src_len = src_len - len;
    (**(code **)((long)p_local + 0x48))(p_local,0);
    data = (uint8_t *)base64_encoded_size(src_len,k._4_4_);
  }
  __assert_fail("n > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_printer.c"
                ,0x13c,
                "void print_uint8_vector_base64_object(flatcc_json_printer_t *, const void *, int)")
  ;
}

Assistant:

static void print_uint8_vector_base64_object(flatcc_json_printer_t *ctx, const void *p, int mode)
{
    const int unpadded_mode = mode & ~base64_enc_modifier_padding;
    size_t k, n, len;
    const uint8_t *data;
    size_t data_len, src_len;

    data_len = (size_t)__flatbuffers_uoffset_read_from_pe(p);
    data = (const uint8_t *)p + uoffset_size;

    print_char('\"');

    len = base64_encoded_size(data_len, mode);
    if (ctx->p + len >= ctx->pflush) {
        ctx->flush(ctx, 0);
    }
    while (ctx->p + len > ctx->pflush) {
        /* Multiples of 4 output chars consumes exactly 3 bytes before final padding. */
        k = (size_t)(ctx->pflush - ctx->p) & ~(size_t)3;
        n = k * 3 / 4;
        FLATCC_ASSERT(n > 0);
        src_len = k * 3 / 4;
        base64_encode((uint8_t *)ctx->p, data, 0, &src_len, unpadded_mode);
        ctx->p += k;
        data += n;
        data_len -= n;
        ctx->flush(ctx, 0);
        len = base64_encoded_size(data_len, mode);
    }
    base64_encode((uint8_t *)ctx->p, data, 0, &data_len, mode);
    ctx->p += len;
    print_char('\"');
}